

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

bool has_this(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v,VarId *s)

{
  uint32_t uVar1;
  pointer pVVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  bool bVar8;
  
  pVVar2 = (v->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(v->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)pVVar2;
  bVar8 = lVar4 != 0;
  if (bVar8) {
    uVar5 = lVar4 >> 4;
    if (pVVar2->id != s->id) {
      puVar6 = &pVVar2[1].id;
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar5 + (uVar5 == 0) == uVar7) break;
        uVar1 = *puVar6;
        puVar6 = puVar6 + 4;
        uVar3 = uVar7 + 1;
      } while (uVar1 != s->id);
      bVar8 = uVar7 < uVar5;
    }
  }
  return bVar8;
}

Assistant:

bool has_this(vector<mir::inst::VarId> v, mir::inst::VarId s) {
  for (int i = 0; i < v.size(); i++) {
    if (v[i] == s) {
      return true;
    }
  }
  return false;
}